

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LdapStrategy.cpp
# Opt level: O2

void __thiscall
Vault::LdapStrategy::LdapStrategy(LdapStrategy *this,string *username,string *password)

{
  (this->super_AuthenticationStrategy)._vptr_AuthenticationStrategy =
       (_func_int **)&PTR__LdapStrategy_001c5720;
  std::__cxx11::string::string((string *)&this->username_,(string *)username);
  std::__cxx11::string::string((string *)&this->password_,(string *)password);
  return;
}

Assistant:

Vault::LdapStrategy::LdapStrategy(std::string username, std::string password)
    : username_(std::move(username)), password_(std::move(password)) {}